

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

CTPNStm * __thiscall CTcParser::parse_do_while(CTcParser *this,int *err)

{
  tc_toktyp_t tVar1;
  int iVar2;
  CTPNStmEnclosing *stm;
  CTPNStm *body;
  CTcPrsNode *cond;
  CTcTokFileDesc *desc;
  long linenum;
  int *in_RSI;
  CTcTokenizer *in_RDI;
  int in_stack_00000014;
  CTPNStmSwitch *in_stack_00000018;
  int *in_stack_00000020;
  CTcParser *in_stack_00000028;
  CTPNStmEnclosing *old_enclosing;
  CTPNStmDoWhile *do_stm;
  CTcPrsNode *expr;
  CTPNStm *body_stm;
  CTPNStmEnclosing *in_stack_ffffffffffffff98;
  CTPNStmDoWhileBase *this_00;
  CTcTokenizer *in_stack_ffffffffffffffa0;
  CTPNStmDoWhileBase *local_8;
  
  local_8 = (CTPNStmDoWhileBase *)CTcPrsAllocObj::operator_new(0x2bcce2);
  CTPNStmDoWhile::CTPNStmDoWhile
            ((CTPNStmDoWhile *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar2 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  CTcTokenizer::next(in_RDI);
  stm = set_enclosing_stm((CTcParser *)in_RDI,(CTPNStmEnclosing *)local_8);
  body = parse_stm(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000014);
  set_enclosing_stm((CTcParser *)in_RDI,stm);
  if (*in_RSI == 0) {
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bcd9f);
    if (tVar1 == TOKT_WHILE) {
      CTcTokenizer::next(in_RDI);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffffa0,iVar2);
    }
    tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bcdd8);
    if (tVar1 == TOKT_LPAR) {
      CTcTokenizer::next(in_RDI);
    }
    else {
      CTcTokenizer::log_error_curtok(in_stack_ffffffffffffffa0,iVar2);
    }
    cond = parse_cond_expr((CTcParser *)in_stack_ffffffffffffffa0);
    if (cond == (CTcPrsNode *)0x0) {
      *in_RSI = 1;
      local_8 = (CTPNStmDoWhileBase *)0x0;
    }
    else {
      tVar1 = CTcTokenizer::cur((CTcTokenizer *)0x2bce41);
      if (tVar1 == TOKT_RPAR) {
        CTcTokenizer::next(in_RDI);
      }
      else {
        CTcTokenizer::log_error_curtok(in_stack_ffffffffffffffa0,iVar2);
      }
      CTPNStmDoWhileBase::set_cond(local_8,cond);
      CTPNStmDoWhileBase::set_body(local_8,body);
      this_00 = local_8;
      desc = CTcTokenizer::get_last_desc(G_tok);
      linenum = CTcTokenizer::get_last_linenum(G_tok);
      CTPNStmDoWhileBase::set_while_pos(this_00,desc,linenum);
      iVar2 = parse_req_sem();
      if (iVar2 != 0) {
        *in_RSI = 1;
        local_8 = (CTPNStmDoWhileBase *)0x0;
      }
    }
  }
  else {
    local_8 = (CTPNStmDoWhileBase *)0x0;
  }
  return (CTPNStm *)local_8;
}

Assistant:

CTPNStm *CTcParser::parse_do_while(int *err)
{
    CTPNStm *body_stm;
    CTcPrsNode *expr;
    CTPNStmDoWhile *do_stm;
    CTPNStmEnclosing *old_enclosing;
    
    /* create the statement object */
    do_stm = new CTPNStmDoWhile(enclosing_stm_);

    /* skip the 'do' keyword */
    G_tok->next();

    /* set the 'do' to be the enclosing statement */
    old_enclosing = set_enclosing_stm(do_stm);

    /* parse the loop body */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* return on failure */
    if (*err)
        return 0;

    /* require the 'while' keyword */
    if (G_tok->cur() == TOKT_WHILE)
    {
        /* skip the 'while' */
        G_tok->next();
    }
    else
    {
        /* 
         *   no 'while' keyword - there's no obvious way to correct this,
         *   so simply ignore the 'do' statement and keep going from here,
         *   on the assumption that they inadvertantly started a new
         *   statement without finishing the 'do' 
         */
        G_tok->log_error_curtok(TCERR_REQ_DO_WHILE);
    }

    /* require the open paren */
    if (G_tok->cur() == TOKT_LPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_LPAR);

    /* parse the expression */
    expr = parse_cond_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* require the close paren */
    if (G_tok->cur() == TOKT_RPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_RPAR);

    /* set the condition expression and body in the 'do' node */
    do_stm->set_cond(expr);
    do_stm->set_body(body_stm);

    /* 
     *   remember the location of the 'while' part, since this part
     *   generates code 
     */
    do_stm->set_while_pos(G_tok->get_last_desc(), G_tok->get_last_linenum());

    /* parse the required closing semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the new 'do-while' node */
    return do_stm;
}